

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_CallCommon<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,
          RecyclableObject *function,uint flags,AuxArray<unsigned_int> *spreadIndices)

{
  undefined1 uVar1;
  byte bVar2;
  undefined1 uVar3;
  short sVar4;
  long lVar5;
  code *pcVar6;
  bool bVar7;
  ArgSlot argCount;
  uint uVar8;
  undefined4 *puVar9;
  Var value;
  JavascriptMethod p_Var10;
  Arguments local_90;
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  CallInfo CStack_50;
  Arguments args;
  
  lVar5 = *(long *)(*(long *)(this + 0x78) + 0x3b8);
  uVar1 = *(undefined1 *)(lVar5 + 0x1570);
  args.Values = (Type)function;
  bVar7 = IsInDebugMode(this);
  if (bVar7) {
    JavascriptFunction::CheckValidDebugThunk
              (*(ScriptContext **)(this + 0x78),(RecyclableObject *)args.Values);
  }
  bVar2 = (playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
          super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.ArgCount;
  uVar3 = *(undefined1 *)(lVar5 + 0x10a);
  *(undefined1 *)(lVar5 + 0x10a) = 1;
  uVar8 = flags << 0x18 | (uint)bVar2;
  if ((playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return == -1) {
    CStack_50._0_4_ = uVar8 | 0x10000000;
    CStack_50._4_4_ = 0;
    args.Info = *(Type *)(this + 0x28);
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf7d,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar7) goto LAB_0097257d;
      *puVar9 = 0;
    }
    argCount = CallInfo::GetArgCountWithExtraArgs(&CStack_50);
    if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)args.Values);
      local_80.Info = CStack_50;
      local_80.Values = (Type)args.Info;
      JavascriptFunction::CallFunction<true>
                ((RecyclableObject *)args.Values,p_Var10,&local_80,false);
    }
    else {
      local_90.Info = CStack_50;
      local_90.Values = (Type)args.Info;
      JavascriptFunction::CallSpreadFunction
                ((RecyclableObject *)args.Values,&local_90,spreadIndices);
    }
  }
  else {
    CStack_50._0_4_ = uVar8 | 0x2000000;
    CStack_50._4_4_ = 0;
    args.Info = *(Type *)(this + 0x28);
    if (0xff < flags) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0xf8c,"(static_cast<unsigned>(args.Info.Flags) == flags)",
                                  "Flags don\'t fit into the CallInfo field?");
      if (!bVar7) {
LAB_0097257d:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar9 = 0;
    }
    argCount = CallInfo::GetArgCountWithExtraArgs(&CStack_50);
    sVar4 = (playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
            super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return;
    if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
      p_Var10 = RecyclableObject::GetEntryPoint((RecyclableObject *)args.Values);
      local_60.Info = CStack_50;
      local_60.Values = (Type)args.Info;
      value = JavascriptFunction::CallFunction<true>
                        ((RecyclableObject *)args.Values,p_Var10,&local_60,false);
    }
    else {
      local_70.Info = CStack_50;
      local_70.Values = (Type)args.Info;
      value = JavascriptFunction::CallSpreadFunction
                        ((RecyclableObject *)args.Values,&local_70,spreadIndices);
    }
    SetReg<unsigned_int>(this,(int)sVar4,value);
  }
  *(undefined1 *)(lVar5 + 0x10a) = uVar3;
  *(undefined1 *)(lVar5 + 0x1570) = uVar1;
  PopOut(this,argCount);
  return;
}

Assistant:

void InterpreterStackFrame::OP_CallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always save and restore implicit call flags when calling out
        // REVIEW: Can we avoid it if we don't collect dynamic profile info?
        ThreadContext * threadContext = scriptContext->GetThreadContext();
        Js::ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();

#ifdef ENABLE_SCRIPT_DEBUGGING
#if DBG
        if (this->IsInDebugMode())
        {
            JavascriptFunction::CheckValidDebugThunk(scriptContext, function);
        }
#endif
#endif
        ArgSlot argCount = playout->ArgCount;
        BEGIN_SAFE_REENTRANT_REGION(threadContext)
        {
            if (playout->Return == Js::Constants::NoRegister)
            {
                flags |= CallFlags_NotUsed;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    JavascriptFunction::CallSpreadFunction(function, args, spreadIndices);
                }
                else
                {
                    JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args);
                }
            }
            else
            {
                flags |= CallFlags_Value;
                Arguments args(CallInfo((CallFlags)flags, argCount), m_outParams);
                AssertMsg(static_cast<unsigned>(args.Info.Flags) == flags, "Flags don't fit into the CallInfo field?");
                argCount = args.GetArgCountWithExtraArgs();
                if (spreadIndices != nullptr)
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallSpreadFunction(function, args, spreadIndices));
                }
                else
                {
                    SetReg((RegSlot)playout->Return, JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), args));
                }
            }
        }
        END_SAFE_REENTRANT_REGION

            threadContext->SetImplicitCallFlags(savedImplicitCallFlags);
        PopOut(argCount);
    }